

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  Json *pJVar4;
  UIntToStringBuffer buffer;
  allocator local_29;
  byte local_28 [22];
  byte local_12 [10];
  
  pJVar4 = (Json *)-(long)this;
  if (0 < (long)this) {
    pJVar4 = this;
  }
  local_12[2] = 0;
  pbVar2 = local_12 + 1;
  do {
    pbVar3 = pbVar2;
    *pbVar3 = (char)pJVar4 + (char)(Json *)((ulong)pJVar4 / 10) * -10 | 0x30;
    pbVar2 = pbVar3 + -1;
    bVar1 = (Json *)0x9 < pJVar4;
    pJVar4 = (Json *)((ulong)pJVar4 / 10);
  } while (bVar1);
  if ((long)this < 0) {
    *pbVar2 = 0x2d;
    pbVar3 = pbVar2;
  }
  if (pbVar3 < local_28) {
    __assert_fail("current >= buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                  ,0x50,"std::string Json::valueToString(LargestInt)");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar3,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  bool isNegative = value < 0;
  if (isNegative)
    value = -value;
  uintToString(LargestUInt(value), current);
  if (isNegative)
    *--current = '-';
  assert(current >= buffer);
  return current;
}